

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::BeginFrameSourceState> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::BeginFrameSourceState>::operator=
          (CopyablePtr<perfetto::protos::gen::BeginFrameSourceState> *this,
          CopyablePtr<perfetto::protos::gen::BeginFrameSourceState> *other)

{
  BeginFrameSourceState *this_00;
  CopyablePtr<perfetto::protos::gen::BeginFrameSourceState> *other_local;
  CopyablePtr<perfetto::protos::gen::BeginFrameSourceState> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::BeginFrameSourceState,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (BeginFrameSourceState *)operator_new(0x48);
  perfetto::protos::gen::BeginFrameSourceState::BeginFrameSourceState(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::BeginFrameSourceState,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }